

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

void touch_file(char *path)

{
  FILE *__stream;
  int iVar1;
  bool bVar2;
  
  __stream = fopen64("testfile","w+");
  if (__stream != (FILE *)0x0) {
    iVar1 = touch_file::count + 1;
    touch_file::count = iVar1;
    while (bVar2 = iVar1 != 0, iVar1 = iVar1 + -1, bVar2) {
      fputc(0x2a,__stream);
    }
    fclose(__stream);
    return;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-poll.c"
          ,0x3b,"(fp = fopen(FIXTURE, \"w+\"))");
  abort();
}

Assistant:

static void touch_file(const char* name) {
  int r;
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;

  r = uv_fs_open(NULL, &req, name, O_RDWR, 0, NULL);
  ASSERT(r >= 0);
  file = r;
  uv_fs_req_cleanup(&req);

  buf = uv_buf_init("foo", 4);
  r = uv_fs_write(NULL, &req, file, &buf, 1, -1, NULL);
  ASSERT(r >= 0);
  uv_fs_req_cleanup(&req);

  r = uv_fs_close(NULL, &req, file, NULL);
  ASSERT(r == 0);
  uv_fs_req_cleanup(&req);
}